

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

vm_prop_id_t __thiscall CTcSymProp::gen_code_propid(CTcSymProp *this,int check_only,int is_expr)

{
  int in_EDX;
  int in_ESI;
  CTcDataStream *in_RDI;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  CTcCodeStream *pCVar1;
  undefined2 local_2;
  
  if (in_EDX == 0) {
    local_2 = CTcSymPropBase::get_prop((CTcSymPropBase *)in_RDI);
  }
  else {
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      pCVar1 = G_cs;
      CTcSymPropBase::get_prop((CTcSymPropBase *)in_RDI);
      CTcDataStream::write_prop_id(in_RDI,(uint)((ulong)pCVar1 >> 0x20));
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcGenTarg::note_push((CTcGenTarg *)0x2d7a34);
    }
    local_2 = 0;
  }
  return local_2;
}

Assistant:

vm_prop_id_t CTcSymProp::gen_code_propid(int check_only, int is_expr)
{
    /*
     *   If I'm to be treated as an expression (which indicates that the
     *   property symbol is explicitly enclosed in parentheses in the
     *   original source code expression), then I must evaluate this
     *   property of self.  Otherwise, I yield literally the property ID. 
     */
    if (is_expr)
    {
        /* generate code unless we're only checking */
        if (!check_only)
        {
            /* evaluate this property of self */
            G_cg->write_op(OPC_GETPROPSELF);
            G_cs->write_prop_id(get_prop());

            /* leave the result on the stack */
            G_cg->write_op(OPC_GETR0);
            G_cg->note_push();
        }

        /* tell the caller to use the stack value */
        return VM_INVALID_PROP;
    }
    else
    {
        /* simple '.prop' - return my property ID as a constant value */
        return get_prop();
    }
}